

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_stats.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__haystack;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int code;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  long lVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  double val;
  double vtop;
  double vdel;
  double vbot;
  double local_78;
  double local_68;
  double local_60;
  double local_48;
  double local_40;
  double local_38;
  
  if (2 < argc) {
    __haystack = argv[1];
    pcVar7 = strstr(__haystack,"help");
    if (pcVar7 == (char *)0x0) {
      bVar1 = true;
      bVar5 = true;
      uVar6 = 1;
      bVar2 = true;
      if (*__haystack == '-') {
        if ((__haystack[1] != 'q') || (__haystack[2] != '\0')) {
          if ((__haystack[1] == 'd') && (__haystack[2] == '\0')) {
            uVar6 = 2;
            bVar2 = false;
            goto LAB_001024ee;
          }
          if ((__haystack[1] != '1') || (__haystack[2] != '\0')) {
            if ((__haystack[1] != 'z') || (__haystack[2] != '\0')) {
              if (__haystack[1] == 'h') {
                uVar6 = 2 - (__haystack[2] != '\0');
                bVar2 = __haystack[2] != '\0';
              }
              goto LAB_001024e8;
            }
            uVar6 = 2;
            bVar1 = false;
            bVar2 = true;
            bVar3 = true;
            bVar4 = false;
            goto LAB_001024f4;
          }
          uVar6 = 2;
          bVar2 = true;
          bVar3 = false;
          bVar5 = true;
          goto LAB_001024f1;
        }
        uVar6 = 2;
        bVar1 = true;
        bVar2 = true;
        bVar3 = true;
        bVar4 = true;
        bVar5 = true;
      }
      else {
LAB_001024e8:
        bVar1 = bVar2;
        bVar2 = true;
LAB_001024ee:
        bVar3 = true;
        bVar5 = bVar1;
LAB_001024f1:
        bVar1 = false;
        bVar4 = true;
      }
LAB_001024f4:
      local_40 = 0.0;
      local_48 = 0.0;
      local_38 = 0.0;
      __isoc99_sscanf(argv[uVar6],"%lf:%lf:%lf",&local_38,&local_48);
      if (local_48 <= local_38) {
        local_40 = 0.0;
LAB_00102554:
        local_48 = local_38;
      }
      else if (local_40 <= 0.0) goto LAB_00102554;
      code = nifti_intent_code(argv[(ulong)uVar6 + 1]);
      if (code < 0) {
        fprintf(_stderr,"illegal code=%s\n",argv[(ulong)uVar6 + 1]);
        exit(1);
      }
      uVar9 = uVar6 + 2;
      local_60 = 0.0;
      if (uVar9 < (uint)argc) {
        local_68 = strtod(argv[uVar9],(char **)0x0);
        uVar9 = uVar6 + 3;
      }
      else {
        local_68 = 0.0;
      }
      if (uVar9 < (uint)argc) {
        uVar8 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        local_60 = strtod(argv[uVar8],(char **)0x0);
      }
      local_78 = 0.0;
      if (uVar9 < (uint)argc) {
        local_78 = strtod(argv[uVar9],(char **)0x0);
      }
      val = local_38;
      if (local_38 <= local_48) {
        do {
          if (bVar1) {
            dVar13 = nifti_stat2rcdf(val,code,local_68,local_60,local_78);
          }
          else if (bVar2) {
            if (bVar3) {
              if (bVar4) {
                if (bVar5) {
                  dVar13 = nifti_stat2cdf(val,code,local_68,local_60,local_78);
                }
                else {
                  dVar13 = nifti_stat2hzscore(val,code,local_68,local_60,local_78);
                }
              }
              else {
                dVar13 = nifti_stat2zscore(val,code,local_68,local_60,local_78);
              }
            }
            else {
              dVar13 = nifti_cdf2stat(val,code,local_68,local_60,local_78);
            }
          }
          else {
            dVar13 = nifti_stat2cdf(val + 0.001,code,local_68,local_60,local_78);
            dVar14 = nifti_stat2cdf(val,code,local_68,local_60,local_78);
            dVar13 = (dVar13 - dVar14) * 1000.0;
          }
          printf("%.9g\n",dVar13);
        } while ((0.0 < local_40) && (val = val + local_40, val <= local_48));
      }
      goto LAB_0010246c;
    }
  }
  putchar(10);
  puts("Demo program for computing NIfTI statistical functions.");
  puts("Usage: nifti_stats [-q|-d|-1|-z] val CODE [p1 p2 p3]");
  puts(" val can be a single number or in the form bot:top:step.");
  puts(" default ==> output p = Prob(statistic < val).");
  puts("  -q     ==> output is 1-p.");
  puts("  -d     ==> output is density.");
  puts("  -1     ==> output is x such that Prob(statistic < x) = val.");
  puts("  -z     ==> output is z such that Normal cdf(z) = p(val).");
  puts("  -h     ==> output is z such that 1/2-Normal cdf(z) = p(val).");
  puts(" Allowable CODEs:");
  lVar11 = 2;
  cVar10 = '\x05';
  bVar12 = 0;
  do {
    printf("  %-10s",inam[lVar11]);
    if ((byte)((bVar12 / 3 & 0xfe) * '\x03' + cVar10) == '\0') {
      putchar(10);
    }
    lVar11 = lVar11 + 1;
    cVar10 = cVar10 + -1;
    bVar12 = bVar12 + 1;
  } while (lVar11 != 0x19);
  putchar(10);
  puts(" Following CODE are distributional parameters, as needed.");
  putchar(10);
  puts("Results are written to stdout, 1 number per output line.");
  puts("Example (piping output into AFNI program 1dplot):");
  puts(" nifti_stats -d 0:4:.001 INVGAUSS 1 3 | 1dplot -dx 0.001 -stdin");
  putchar(10);
  puts("Author - RW Cox - SSCC/NIMH/NIH/DHHS/USA/EARTH - March 2004");
  putchar(10);
LAB_0010246c:
  exit(0);
}

Assistant:

int main( int argc , char *argv[] )
{
   double val , p , p1=0.0,p2=0.0,p3=0.0 ;
   double vbot,vtop,vdel ;
   int code , iarg=1 , doq=0 , dod=0 , doi=0 , doz=0 , doh=0 ;

   /*-- print some help for the pitiful user --*/

   if( argc < 3 || strstr(argv[1],"help") != NULL ){
    int ii ;
    printf("\n") ;
    printf("Demo program for computing NIfTI statistical functions.\n") ;
    printf("Usage: nifti_stats [-q|-d|-1|-z] val CODE [p1 p2 p3]\n") ;
    printf(" val can be a single number or in the form bot:top:step.\n") ;
    printf(" default ==> output p = Prob(statistic < val).\n") ;
    printf("  -q     ==> output is 1-p.\n") ;
    printf("  -d     ==> output is density.\n") ;
    printf("  -1     ==> output is x such that Prob(statistic < x) = val.\n") ;
    printf("  -z     ==> output is z such that Normal cdf(z) = p(val).\n") ;
    printf("  -h     ==> output is z such that 1/2-Normal cdf(z) = p(val).\n");
    printf(" Allowable CODEs:\n") ;
    for( ii=NIFTI_FIRST_STATCODE ; ii <= NIFTI_LAST_STATCODE ; ii++ ){
     printf("  %-10s",inam[ii]); if((ii-NIFTI_FIRST_STATCODE)%6==5)printf("\n");
    }
    printf("\n") ;
    printf(" Following CODE are distributional parameters, as needed.\n");
    printf("\n") ;
    printf("Results are written to stdout, 1 number per output line.\n") ;
    printf("Example (piping output into AFNI program 1dplot):\n") ;
    printf(" nifti_stats -d 0:4:.001 INVGAUSS 1 3 | 1dplot -dx 0.001 -stdin\n");
    printf("\n") ;
    printf("Author - RW Cox - SSCC/NIMH/NIH/DHHS/USA/EARTH - March 2004\n") ;
    printf("\n") ;
    exit(0) ;
   }

   /*-- check first arg to see if it is an output option;
        if so, set the appropriate output flag to determine what to compute --*/

        if( strcmp(argv[iarg],"-q") == 0 ){ doq = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-d") == 0 ){ dod = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-1") == 0 ){ doi = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-z") == 0 ){ doz = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-h") == 0 ){ doh = 1 ; iarg++ ; }

   /*-- get the value(s) to process --*/

   vbot=vtop=vdel = 0.0 ;
   sscanf( argv[iarg++] , "%lf:%lf:%lf" , &vbot,&vtop,&vdel ) ;
   if( vbot >= vtop ) vdel = 0.0 ;
   if( vdel <= 0.0  ) vtop = vbot ;

   /*-- decode the CODE into the integer signifying the distribution --*/

   code = nifti_intent_code(argv[iarg++]) ;
     if( code < 0 ){ fprintf(stderr,"illegal code=%s\n",argv[iarg-1]); exit(1); }

   /*-- get the parameters, if present (defaults are 0) --*/

   if( argc > iarg ) p1 = strtod(argv[iarg++],NULL) ;
   if( argc > iarg ) p2 = strtod(argv[iarg++],NULL) ;
   if( argc > iarg ) p3 = strtod(argv[iarg++],NULL) ;

   /*-- loop over input value(s), compute output, write to stdout --*/

   for( val=vbot ; val <= vtop ; val += vdel ){
     if( doq )                                        /* output = 1-cdf */
       p = nifti_stat2rcdf( val , code,p1,p2,p3 ) ;
     else if( dod )                                   /* output = density */
       p = 1000.0*( nifti_stat2cdf(val+.001,code,p1,p2,p3)
                   -nifti_stat2cdf(val     ,code,p1,p2,p3)) ;
     else if( doi )                                   /* output = inverse */
       p = nifti_cdf2stat( val , code,p1,p2,p3 ) ;
     else if( doz )                                   /* output = z score */
       p = nifti_stat2zscore( val , code,p1,p2,p3 ) ;
     else if( doh )                                   /* output = halfz score */
       p = nifti_stat2hzscore( val , code,p1,p2,p3 ) ;
     else                                              /* output = cdf */
       p = nifti_stat2cdf( val , code,p1,p2,p3 ) ;

     printf("%.9g\n",p) ;
     if( vdel <= 0.0 ) break ;  /* the case of just 1 value */
   }

   /*-- terminus est --*/

   exit(0) ;
}